

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

size_t __thiscall
CVmObjGramProd::build_alt_props_list(CVmObjGramProd *this,vm_obj_id_t match_obj,CVmObjList *lst)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long *plVar4;
  size_t idx;
  vm_prop_id_t *pvVar5;
  vm_val_t v;
  vm_val_t local_40;
  
  if (*(long *)((this->super_CVmObject).ext_ + 0x38) == 0) {
    idx = 0;
  }
  else {
    plVar4 = *(long **)((this->super_CVmObject).ext_ + 0x30);
    idx = 0;
    uVar3 = 0;
    do {
      lVar1 = *plVar4;
      if (((*(int *)(lVar1 + 8) == 0) && (*(vm_obj_id_t *)(lVar1 + 0xc) == match_obj)) &&
         (*(long *)(lVar1 + 0x18) != 0)) {
        pvVar5 = *(vm_prop_id_t **)(lVar1 + 0x10);
        uVar2 = 0;
        do {
          if (*pvVar5 != 0) {
            if (lst != (CVmObjList *)0x0) {
              local_40.val.prop = *pvVar5;
              local_40.typ = VM_PROP;
              CVmObjList::cons_set_element(lst,idx,&local_40);
            }
            idx = idx + 1;
          }
          uVar2 = uVar2 + 1;
          pvVar5 = pvVar5 + 0x10;
        } while (uVar2 < *(ulong *)(lVar1 + 0x18));
      }
      uVar3 = uVar3 + 1;
      plVar4 = plVar4 + 1;
    } while (uVar3 < *(ulong *)((this->super_CVmObject).ext_ + 0x38));
  }
  return idx;
}

Assistant:

size_t CVmObjGramProd::build_alt_props_list(
    VMG_ vm_obj_id_t match_obj, CVmObjList *lst)
{
    /* we haven't stored any properties yet */
    size_t n = 0;
    
    /* run through the surviving alternatives */
    vmgram_alt_info **alts = get_ext()->alts_;
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i, ++alts)
    {
        /* 
         *   if this alternative isn't being deleted, and it's associated
         *   with the given match object, add its properties to the list 
         */
        vmgram_alt_info *alt = *alts;
        if (!alt->del && alt->proc_obj == match_obj)
        {
            /* scan its token list */
            vmgram_tok_info *tok = alt->toks;
            for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
            {
                /* if this token has a target property, add it to the list */
                if (tok->prop != VM_INVALID_PROP)
                {
                    /* if we have a list, store it */
                    if (lst != 0)
                    {
                        vm_val_t v;
                        v.set_propid(tok->prop);
                        lst->cons_set_element(n, &v);
                    }
                    
                    /* count it */
                    ++n;
                }
            }
        }
    }

    /* return the number of properties we stored */
    return n;
}